

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.h
# Opt level: O2

void __thiscall phyr::MemoryPool::reset(MemoryPool *this)

{
  int in_ECX;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_00000008;
  
  this->curBlockOffset = 0;
  std::__cxx11::
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ::splice(&this->freeBlocks,
           (int)(this->freeBlocks).
                super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                ._M_impl._M_node.super__List_node_base._M_next,(__off64_t *)&this->usedBlocks,in_ECX
           ,in_R8,in_R9,in_stack_00000008);
  return;
}

Assistant:

void reset() {
        // Don't stash, current block can be reused
        curBlockOffset = 0;
        // Move all used block data to free blocks set
        freeBlocks.splice(freeBlocks.begin(), usedBlocks);
    }